

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

int anon_unknown.dwarf_58::compareColors(void *arg1,void *arg2)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)*(byte *)((long)arg1 + 7);
  uVar2 = (uint)*(byte *)((long)arg2 + 7);
  if (*(byte *)((long)arg1 + 7) == *(byte *)((long)arg2 + 7)) {
    if (*arg2 - *arg1 != 0) {
      return *arg2 - *arg1;
    }
    uVar1 = (uint)*(byte *)((long)arg1 + 4);
    uVar2 = (uint)*(byte *)((long)arg2 + 4);
    if (*(byte *)((long)arg1 + 4) == *(byte *)((long)arg2 + 4)) {
      uVar1 = (uint)*(byte *)((long)arg1 + 5);
      uVar2 = (uint)*(byte *)((long)arg2 + 5);
      if (*(byte *)((long)arg1 + 5) == *(byte *)((long)arg2 + 5)) {
        uVar1 = (uint)*(byte *)((long)arg1 + 6);
        uVar2 = (uint)*(byte *)((long)arg2 + 6);
      }
    }
  }
  return uVar1 - uVar2;
}

Assistant:

int compareColors(const void *arg1, const void *arg2)
  {
    if ( ((COLORS*)arg1)->a != ((COLORS*)arg2)->a )
      return (int)(((COLORS*)arg1)->a) - (int)(((COLORS*)arg2)->a);

    if ( ((COLORS*)arg1)->num != ((COLORS*)arg2)->num )
      return (int)(((COLORS*)arg2)->num) - (int)(((COLORS*)arg1)->num);

    if ( ((COLORS*)arg1)->r != ((COLORS*)arg2)->r )
      return (int)(((COLORS*)arg1)->r) - (int)(((COLORS*)arg2)->r);

    if ( ((COLORS*)arg1)->g != ((COLORS*)arg2)->g )
      return (int)(((COLORS*)arg1)->g) - (int)(((COLORS*)arg2)->g);

    return (int)(((COLORS*)arg1)->b) - (int)(((COLORS*)arg2)->b);
  }